

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O0

void column_test_base_boundary_z2_methods<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>>
               (void)

{
  initializer_list<bool> __l;
  initializer_list<bool> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<bool> __l_02;
  initializer_list<unsigned_int> __l_03;
  undefined8 uVar1;
  bool bVar2;
  uint columnIndex;
  size_type sVar3;
  lazy_ostream *plVar4;
  undefined4 local_5c4;
  size_t local_5c0;
  basic_cstring<const_char> local_5b8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_5a8;
  basic_cstring<const_char> local_580;
  basic_cstring<const_char> local_570;
  basic_cstring<const_char> local_560;
  basic_cstring<const_char> local_550;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_540;
  vector<bool,_std::allocator<bool>_> local_520;
  assertion_result local_4f8;
  basic_cstring<const_char> local_4e0;
  basic_cstring<const_char> local_4d0;
  initializer_list<bool> local_4c0;
  undefined4 local_4ac;
  size_t local_4a8;
  basic_cstring<const_char> local_4a0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_490;
  basic_cstring<const_char> local_468;
  basic_cstring<const_char> local_458;
  basic_cstring<const_char> local_448;
  basic_cstring<const_char> local_438;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_428;
  vector<bool,_std::allocator<bool>_> local_408;
  assertion_result local_3e0;
  basic_cstring<const_char> local_3c8;
  basic_cstring<const_char> local_3b8;
  bool local_3a7 [7];
  iterator local_3a0;
  undefined8 local_398;
  undefined4 local_38c;
  size_t local_388;
  basic_cstring<const_char> local_380;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_370;
  basic_cstring<const_char> local_348;
  basic_cstring<const_char> local_338;
  basic_cstring<const_char> local_328;
  basic_cstring<const_char> local_318;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_308;
  vector<bool,_std::allocator<bool>_> local_2e8;
  assertion_result local_2c0;
  basic_cstring<const_char> local_2a8;
  basic_cstring<const_char> local_298;
  bool local_287 [7];
  iterator local_280;
  undefined8 local_278;
  allocator<unsigned_int> local_269;
  uint local_268 [8];
  iterator local_248;
  size_type local_240;
  undefined1 local_238 [8];
  vector<unsigned_int,_std::allocator<unsigned_int>_> permutation;
  size_t local_218;
  basic_cstring<const_char> local_210;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_200;
  basic_cstring<const_char> local_1d8;
  basic_cstring<const_char> local_1c8;
  basic_cstring<const_char> local_1b8;
  basic_cstring<const_char> local_1a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_198;
  vector<bool,_std::allocator<bool>_> local_178;
  assertion_result local_150;
  basic_cstring<const_char> local_138;
  basic_cstring<const_char> local_128;
  bool local_117 [7];
  iterator local_110;
  undefined8 local_108;
  allocator<unsigned_int> local_f9;
  uint local_f8 [6];
  iterator local_e0;
  size_type local_d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d0;
  undefined1 local_b8 [8];
  Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
  col;
  Column_z2_settings local_31;
  undefined1 local_30 [7];
  Column_settings settings;
  vector<bool,_std::allocator<bool>_> veccont;
  
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)local_30);
  Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>
  ::Column_z2_settings::Column_z2_settings(&local_31);
  local_f8[0] = 0;
  local_f8[1] = 1;
  local_f8[2] = 2;
  local_f8[3] = 5;
  local_f8[4] = 6;
  local_e0 = local_f8;
  local_d8 = 5;
  std::allocator<unsigned_int>::allocator(&local_f9);
  __l_03._M_len = local_d8;
  __l_03._M_array = local_e0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_d0,__l_03,&local_f9);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
  ::Vector_column<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
              *)local_b8,&local_d0,&local_31);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_d0);
  std::allocator<unsigned_int>::~allocator(&local_f9);
  local_117[0] = true;
  local_117[1] = true;
  local_117[2] = true;
  local_117[3] = false;
  local_117[4] = false;
  local_117[5] = true;
  local_117[6] = true;
  local_110 = local_117;
  local_108 = 7;
  __l_02._M_len = 7;
  __l_02._M_array = local_110;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_30,__l_02);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_128,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_138);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_128,0x290,&local_138);
    sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_30);
    Gudhi::persistence_matrix::
    Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
    ::get_content(&local_178,
                  (Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                   *)local_b8,(int)sVar3);
    bVar2 = std::operator==(&local_178,(vector<bool,_std::allocator<bool>_> *)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_150,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1a8,"col.get_content(veccont.size()) == veccont",0x2a);
    boost::unit_test::operator<<(&local_198,plVar4,&local_1a8);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_150,&local_198,&local_1b8,0x290,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_198);
    boost::test_tools::assertion_result::~assertion_result(&local_150);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_178);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1d8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1c8,0x291,&local_1d8);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_200,plVar4,(char (*) [1])0x28c14a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_218 = Gudhi::persistence_matrix::
                Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                ::size((Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                        *)local_b8);
    permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_200,&local_210,0x291,1,2,&local_218,"col.size()",
               (undefined1 *)
               ((long)&permutation.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 4),"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_200);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  local_268[4] = 1;
  local_268[5] = 4;
  local_268[6] = 6;
  local_268[0] = 0;
  local_268[1] = 5;
  local_268[2] = 2;
  local_268[3] = 3;
  local_248 = local_268;
  local_240 = 7;
  std::allocator<unsigned_int>::allocator(&local_269);
  __l_01._M_len = local_240;
  __l_01._M_array = local_248;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_238,__l_01,&local_269);
  std::allocator<unsigned_int>::~allocator(&local_269);
  columnIndex = Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>
                ::get_null_value<unsigned_int>();
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
  ::reorder<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<true,(Gudhi::persistence_matrix::Column_types)3,true,true,true>>>
              *)local_b8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_238,
             columnIndex);
  local_287[0] = true;
  local_287[1] = false;
  local_287[2] = true;
  local_287[3] = false;
  local_287[4] = true;
  local_287[5] = true;
  local_287[6] = true;
  local_280 = local_287;
  local_278 = 7;
  __l_00._M_len = 7;
  __l_00._M_array = local_280;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_30,__l_00);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_298,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_2a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_298,0x296,&local_2a8);
    sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_30);
    Gudhi::persistence_matrix::
    Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
    ::get_content(&local_2e8,
                  (Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                   *)local_b8,(int)sVar3);
    bVar2 = std::operator==(&local_2e8,(vector<bool,_std::allocator<bool>_> *)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_2c0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_318,"col.get_content(veccont.size()) == veccont",0x2a);
    boost::unit_test::operator<<(&local_308,plVar4,&local_318);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_328,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_2c0,&local_308,&local_328,0x296,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_308);
    boost::test_tools::assertion_result::~assertion_result(&local_2c0);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_2e8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_338,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_348);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_338,0x297,&local_348);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_370,plVar4,(char (*) [1])0x28c14a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_380,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_388 = Gudhi::persistence_matrix::
                Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                ::size((Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                        *)local_b8);
    local_38c = 5;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_370,&local_380,0x297,1,2,&local_388,"col.size()",&local_38c,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_370);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
  ::clear((Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
           *)local_b8,2);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
  ::clear((Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
           *)local_b8,6);
  local_3a7[0] = true;
  local_3a7[1] = false;
  local_3a7[2] = false;
  local_3a7[3] = false;
  local_3a7[4] = true;
  local_3a7[5] = true;
  local_3a7[6] = false;
  local_3a0 = local_3a7;
  local_398 = 7;
  __l._M_len = 7;
  __l._M_array = local_3a0;
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_30,__l);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_3c8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_3b8,0x29c,&local_3c8);
    sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_30);
    Gudhi::persistence_matrix::
    Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
    ::get_content(&local_408,
                  (Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                   *)local_b8,(int)sVar3);
    bVar2 = std::operator==(&local_408,(vector<bool,_std::allocator<bool>_> *)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_3e0,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_438,"col.get_content(veccont.size()) == veccont",0x2a);
    boost::unit_test::operator<<(&local_428,plVar4,&local_438);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_448,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_3e0,&local_428,&local_448,0x29c,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_428);
    boost::test_tools::assertion_result::~assertion_result(&local_3e0);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_408);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_458,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_468);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_458,0x29d,&local_468);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_490,plVar4,(char (*) [1])0x28c14a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_4a8 = Gudhi::persistence_matrix::
                Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                ::size((Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                        *)local_b8);
    local_4ac = 3;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_490,&local_4a0,0x29d,1,2,&local_4a8,"col.size()",&local_4ac,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_490);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
  ::clear((Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
           *)local_b8);
  std::initializer_list<bool>::initializer_list(&local_4c0);
  std::vector<bool,_std::allocator<bool>_>::operator=
            ((vector<bool,_std::allocator<bool>_> *)local_30,local_4c0);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4d0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_4e0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_4d0,0x2a1,&local_4e0);
    sVar3 = std::vector<bool,_std::allocator<bool>_>::size
                      ((vector<bool,_std::allocator<bool>_> *)local_30);
    Gudhi::persistence_matrix::
    Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
    ::get_content(&local_520,
                  (Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                   *)local_b8,(int)sVar3);
    bVar2 = std::operator==(&local_520,(vector<bool,_std::allocator<bool>_> *)local_30);
    boost::test_tools::assertion_result::assertion_result(&local_4f8,bVar2);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_550,"col.get_content(veccont.size()) == veccont",0x2a);
    boost::unit_test::operator<<(&local_540,plVar4,&local_550);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_560,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_4f8,&local_540,&local_560,0x2a1,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_540);
    boost::test_tools::assertion_result::~assertion_result(&local_4f8);
    std::vector<bool,_std::allocator<bool>_>::~vector(&local_520);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_570,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_580);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_570,0x2a2,&local_580);
    plVar4 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_5a8,plVar4,(char (*) [1])0x28c14a);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_5b8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
               ,0x73);
    local_5c0 = Gudhi::persistence_matrix::
                Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                ::size((Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                        *)local_b8);
    local_5c4 = 0;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (&local_5a8,&local_5b8,0x2a2,1,2,&local_5c0,"col.size()",&local_5c4,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_5a8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_238);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
  ::~Vector_column((Vector_column<Column_mini_matrix<Base_col_options<true,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_true>_>_>
                    *)local_b8);
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)local_30)
  ;
  return;
}

Assistant:

void column_test_base_boundary_z2_methods() {
  std::vector<typename Column::Field_element> veccont;
  typename Column::Column_settings settings;

  Column col(std::vector<unsigned int>{0, 1, 2, 5, 6}, &settings);
  veccont = {1, 1, 1, 0, 0, 1, 1};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 5);

  std::vector<unsigned int> permutation{0, 5, 2, 3, 1, 4, 6};
  col.reorder(permutation);
  veccont = {1, 0, 1, 0, 1, 1, 1};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 5);

  col.clear(2);
  col.clear(6);
  veccont = {1, 0, 0, 0, 1, 1, 0};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 3);

  col.clear();
  veccont = {};
  BOOST_CHECK(col.get_content(veccont.size()) == veccont);
  BOOST_CHECK_EQUAL(col.size(), 0);
}